

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::DepthDrawCase::init(DepthDrawCase *this,EVP_PKEY_CTX *ctx)

{
  MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *this_00;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  *this_01;
  pointer pcVar1;
  float *pfVar2;
  BBoxState BVar3;
  int iVar4;
  Context *pCVar5;
  TestLog *log;
  pointer pLVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  ContextType ctxType;
  deUint32 dVar14;
  uint uVar15;
  undefined4 extraout_var;
  RenderTarget *pRVar16;
  ShaderProgram *this_02;
  ObjectWrapper *this_03;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  pointer pLVar17;
  NotSupportedError *pNVar18;
  long *plVar19;
  TestError *this_04;
  ulong uVar20;
  undefined8 *puVar21;
  ulong uVar22;
  pointer pLVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  long lVar25;
  pointer pLVar26;
  char *pcVar27;
  char *pcVar28;
  long lVar29;
  char *pcVar30;
  ulong uVar31;
  pointer pLVar32;
  ulong uVar33;
  ulong uVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined4 uVar38;
  float fVar39;
  undefined4 uVar40;
  float fVar41;
  float fVar42;
  Random rnd;
  ScopedLogSection section;
  ostringstream buf;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  undefined1 local_368 [32];
  undefined1 local_348 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338 [2];
  undefined1 local_318 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  long local_2f0;
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [8];
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8 [6];
  ios_base local_258 [8];
  ios_base local_250 [264];
  string local_148;
  int local_128;
  undefined4 uStack_124;
  long local_118 [2];
  undefined1 local_108 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_78;
  undefined1 local_58 [40];
  
  iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_2f0 = CONCAT44(extraout_var,iVar13);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar11 = glu::contextSupports(ctxType,(ApiType)0x23);
  if ((!bVar11) &&
     (bVar12 = glu::ContextInfo::isExtensionSupported
                         (((this->super_TestCase).m_context)->m_contextInfo,
                          "GL_EXT_primitive_bounding_box"), !bVar12)) {
    pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_2c8 = (undefined1  [8])local_2b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2c8,"Test requires GL_EXT_primitive_bounding_box extension","");
    tcu::NotSupportedError::NotSupportedError(pNVar18,(string *)local_2c8);
    __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if ((!bVar11 && this->m_state == STATE_PER_PRIMITIVE) &&
     (bVar11 = glu::ContextInfo::isExtensionSupported
                         (((this->super_TestCase).m_context)->m_contextInfo,
                          "GL_EXT_tessellation_shader"), !bVar11)) {
    pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_2c8 = (undefined1  [8])local_2b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2c8,"Test requires GL_EXT_tessellation_shader extension","");
    tcu::NotSupportedError::NotSupportedError(pNVar18,(string *)local_2c8);
    __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pRVar16 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar16->m_depthBits == 0) {
    pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_2c8 = (undefined1  [8])local_2b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2c8,"Test requires depth buffer","");
    tcu::NotSupportedError::NotSupportedError(pNVar18,(string *)local_2c8);
    __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pRVar16 = Context::getRenderTarget((this->super_TestCase).m_context);
  if ((0xff < pRVar16->m_width) &&
     (pRVar16 = Context::getRenderTarget((this->super_TestCase).m_context), 0xff < pRVar16->m_height
     )) {
    local_2c8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&_Stack_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&_Stack_2c0,
               "Rendering multiple triangle grids with with different z coordinates.\n",0x45);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&_Stack_2c0,"Topmost grid is green-yellow, other grids are blue-red.\n",
               0x38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&_Stack_2c0,"Expecting only the green-yellow grid to be visible.\n",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&_Stack_2c0,"Setting primitive bounding box ",0x1f);
    bVar11 = this->m_bboxSize == BBOX_EQUAL;
    pcVar27 = "to cover";
    if (bVar11) {
      pcVar27 = "to exactly cover";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&_Stack_2c0,pcVar27,(ulong)bVar11 * 8 + 8);
    bVar11 = this->m_state != STATE_GLOBAL;
    pcVar27 = " each triangle";
    if (!bVar11) {
      pcVar27 = " each grid";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&_Stack_2c0,pcVar27,(ulong)bVar11 * 4 + 10);
    bVar11 = this->m_bboxSize == BBOX_EQUAL;
    pcVar27 = " and include some padding.";
    if (bVar11) {
      pcVar27 = ".";
    }
    lVar25 = 0x1a;
    if (bVar11) {
      lVar25 = 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_2c0,pcVar27,lVar25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_2c0,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&_Stack_2c0,"Set bounding box using ",0x17);
    bVar11 = this->m_state == STATE_GLOBAL;
    pcVar27 = "gl_BoundingBoxEXT output";
    if (bVar11) {
      pcVar27 = "PRIMITIVE_BOUNDING_BOX_EXT state";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&_Stack_2c0,pcVar27,(ulong)bVar11 * 8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_2c0,"\n",1);
    bVar11 = this->m_depthType == DEPTH_USER_DEFINED;
    pcVar27 = glcts::fixed_sample_locations_values + 1;
    if (bVar11) {
      pcVar27 = "Fragment depth is set in the fragment shader";
    }
    lVar25 = 0x2c;
    if (!bVar11) {
      lVar25 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_2c0,pcVar27,lVar25);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&_Stack_2c0);
    std::ios_base::~ios_base(local_250);
    local_58[0x10] = 0;
    local_58._17_8_ = 0;
    local_58._0_8_ = (pointer)0x0;
    local_58[8] = 0;
    local_58._9_7_ = 0;
    memset(local_108,0,0xac);
    pCVar5 = (this->super_TestCase).m_context;
    BVar3 = this->m_state;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2c8,
               "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_colorMix;\nout highp vec4 vtx_colorMix;\n"
               ,0x66);
    if ((BVar3 != STATE_PER_PRIMITIVE) && (this->m_depthType == DEPTH_USER_DEFINED)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2c8,"out highp float v_fragDepth;\n",0x1d);
    }
    if (BVar3 != STATE_PER_PRIMITIVE) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2c8,
                 "uniform highp float u_depthBias;\nuniform highp float u_depthScale;\n",0x43);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2c8,"\nvoid main()\n{\n",0xf);
    bVar11 = this->m_depthType == DEPTH_USER_DEFINED;
    pcVar27 = 
    "\thighp float writtenZ = a_position.w;\n\tgl_Position = vec4(a_position.xy, writtenZ * u_depthScale + u_depthBias, 1.0);\n"
    ;
    if (bVar11) {
      pcVar27 = 
      "\thighp float dummyZ = a_position.z;\n\thighp float writtenZ = a_position.w;\n\tgl_Position = vec4(a_position.xy, dummyZ, 1.0);\n\tv_fragDepth = writtenZ * u_depthScale + u_depthBias;\n"
      ;
    }
    lVar25 = 0x76;
    if (bVar11) {
      lVar25 = 0xb1;
    }
    pcVar28 = "\tgl_Position = a_position;\n";
    if (BVar3 != STATE_PER_PRIMITIVE) {
      pcVar28 = pcVar27;
    }
    lVar29 = 0x1b;
    if (BVar3 != STATE_PER_PRIMITIVE) {
      lVar29 = lVar25;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,pcVar28,lVar29);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2c8,"\tvtx_colorMix = a_colorMix;\n}\n",0x1e);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
    std::ios_base::~ios_base(local_258);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              ((string *)local_318,(_anonymous_namespace_ *)pCVar5,(Context *)local_368._0_8_,
               pcVar27);
    local_348._0_8_ = (ulong)(uint)local_348._4_4_ << 0x20;
    pcVar28 = local_338[0]._M_local_buf + 8;
    local_348._8_8_ = pcVar28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_348 + 8),local_318._0_8_,(char *)(local_318._8_8_ + local_318._0_8_)
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_108 + (local_348._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_348 + 8)
               );
    if ((char *)local_348._8_8_ != pcVar28) {
      operator_delete((void *)local_348._8_8_,local_338[0]._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._0_8_ != &local_308) {
      operator_delete((void *)local_318._0_8_,local_308._M_allocated_capacity + 1);
    }
    if ((Context *)local_368._0_8_ != (Context *)(local_368 + 0x10)) {
      operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
    }
    pCVar5 = (this->super_TestCase).m_context;
    BVar3 = this->m_state;
    pcVar30 = "vtx_colorMix";
    if (BVar3 == STATE_PER_PRIMITIVE) {
      pcVar30 = "tess_eval_colorMix";
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2c8,"${GLSL_VERSION_DECL}\nin mediump vec4 ",0x25);
    lVar25 = 0xc;
    if (BVar3 == STATE_PER_PRIMITIVE) {
      lVar25 = 0x12;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,pcVar30,lVar25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,";\n",2);
    if (this->m_depthType == DEPTH_USER_DEFINED) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2c8,"in mediump float v_fragDepth;\n",0x1e);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2c8,
               "layout(location = 0) out mediump vec4 o_color;\nuniform highp vec4 u_color1;\nuniform highp vec4 u_color2;\n\nvoid main()\n{\n\to_color = mix(u_color1, u_color2, "
               ,0x9b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,pcVar30,lVar25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,");\n",3);
    if (this->m_depthType == DEPTH_USER_DEFINED) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2c8,"\tgl_FragDepth = v_fragDepth * 0.5 + 0.5;\n",0x29);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
    std::ios_base::~ios_base(local_258);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              ((string *)local_318,(_anonymous_namespace_ *)pCVar5,(Context *)local_368._0_8_,
               pcVar27);
    local_348._0_4_ = 1;
    local_348._8_8_ = pcVar28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_348 + 8),local_318._0_8_,(char *)(local_318._8_8_ + local_318._0_8_)
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_108 + (local_348._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_348 + 8)
               );
    if ((char *)local_348._8_8_ != pcVar28) {
      operator_delete((void *)local_348._8_8_,local_338[0]._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._0_8_ != &local_308) {
      operator_delete((void *)local_318._0_8_,local_308._M_allocated_capacity + 1);
    }
    if ((Context *)local_368._0_8_ != (Context *)(local_368 + 0x10)) {
      operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
    }
    if (this->m_state == STATE_PER_PRIMITIVE) {
      pCVar5 = (this->super_TestCase).m_context;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2c8,
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n${PRIMITIVE_BOUNDING_BOX_REQUIRE}\nlayout(vertices=3) out;\n\nuniform highp float u_depthBias;\nuniform highp float u_depthScale;\n\nin highp vec4 vtx_colorMix[];\nout highp vec4 tess_ctrl_colorMix[];\n\nvoid main()\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n\ttess_ctrl_colorMix[gl_InvocationID] = vtx_colorMix[0];\n\n\tgl_TessLevelOuter[0] = 2.8;\n\tgl_TessLevelOuter[1] = 2.8;\n\tgl_TessLevelOuter[2] = 2.8;\n\tgl_TessLevelInner[0] = 2.8;\n\n\t// real Z stored in w component\n\thighp vec4 minBound = vec4(min(min(vec3(gl_in[0].gl_Position.xy, gl_in[0].gl_Position.w * u_depthScale + u_depthBias),\n\t                                   vec3(gl_in[1].gl_Position.xy, gl_in[1].gl_Position.w * u_depthScale + u_depthBias)),\n\t                               vec3(gl_in[2].gl_Position.xy, gl_in[2].gl_Position.w * u_depthScale + u_depthBias)), 1.0);\n\thighp vec4 maxBound = vec4(max(max(vec3(gl_in[0].gl_Position.xy, gl_in[0].gl_Position.w * u_depthScale + u_depthBias),\n\t                                   vec3(gl_in[1].gl_Position.xy, gl_in[1].gl_Position.w * u_depthScale + u_depthBias)),\n\t                               vec3(gl_in[2].gl_Position.xy, gl_in[2].gl_Position.w * u_depthScale + u_depthBias)), 1.0);\n"
                 ,0x4f7);
      bVar11 = this->m_bboxSize == BBOX_EQUAL;
      pcVar30 = 
      "\thighp float nedPadding = mod(gl_in[0].gl_Position.z, 0.3);\n\thighp float posPadding = mod(gl_in[1].gl_Position.z, 0.3);\n\t${PRIM_GL_BOUNDING_BOX}[0] = minBound - vec4(0.0, 0.0, nedPadding, 0.0);\n\t${PRIM_GL_BOUNDING_BOX}[1] = maxBound + vec4(0.0, 0.0, posPadding, 0.0);\n"
      ;
      if (bVar11) {
        pcVar30 = 
        "\t${PRIM_GL_BOUNDING_BOX}[0] = minBound;\n\t${PRIM_GL_BOUNDING_BOX}[1] = maxBound;\n";
      }
      lVar25 = 0x10c;
      if (bVar11) {
        lVar25 = 0x50;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,pcVar30,lVar25);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"}\n",2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
      std::ios_base::~ios_base(local_258);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                ((string *)local_368,(_anonymous_namespace_ *)pCVar5,(Context *)local_2e8._0_8_,
                 pcVar27);
      local_348._0_4_ = 3;
      local_348._8_8_ = pcVar28;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_348 + 8),local_368._0_8_,
                 (pointer)(local_368._0_8_ + local_368._8_8_));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_108 + (local_348._0_8_ & 0xffffffff) * 0x18),
                  (value_type *)(local_348 + 8));
      pCVar5 = (this->super_TestCase).m_context;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2c8,
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n${GPU_SHADER5_REQUIRE}\nlayout(triangles) in;\n\nin highp vec4 tess_ctrl_colorMix[];\nout highp vec4 tess_eval_colorMix;\n"
                 ,0xa9);
      if (this->m_depthType == DEPTH_USER_DEFINED) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2c8,"out highp float v_fragDepth;\n",0x1d);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2c8,
                 "uniform highp float u_depthBias;\nuniform highp float u_depthScale;\n\nprecise gl_Position;\n\nvoid main()\n{\n\thighp vec4 tessellatedPos = gl_TessCoord.x * gl_in[0].gl_Position + gl_TessCoord.y * gl_in[1].gl_Position + gl_TessCoord.z * gl_in[2].gl_Position;\n"
                 ,0xfc);
      bVar11 = this->m_depthType == DEPTH_USER_DEFINED;
      pcVar30 = 
      "\thighp float writtenZ = tessellatedPos.w;\n\tgl_Position = vec4(tessellatedPos.xy, writtenZ * u_depthScale + u_depthBias, 1.0);\n"
      ;
      if (bVar11) {
        pcVar30 = 
        "\thighp float dummyZ = tessellatedPos.z;\n\thighp float writtenZ = tessellatedPos.w;\n\tgl_Position = vec4(tessellatedPos.xy, dummyZ, 1.0);\n\tv_fragDepth = writtenZ * u_depthScale + u_depthBias;\n"
        ;
      }
      lVar25 = 0x7e;
      if (bVar11) {
        lVar25 = 0xbd;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,pcVar30,lVar25);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2c8,"\ttess_eval_colorMix = tess_ctrl_colorMix[0];\n}\n",0x2f);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
      std::ios_base::~ios_base(local_258);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_148,(_anonymous_namespace_ *)pCVar5,
                 (Context *)CONCAT44(uStack_124,local_128),pcVar27);
      local_318._0_4_ = 4;
      local_318._8_8_ = local_308._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_318 + 8),
                 CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_),
                 local_148._M_string_length +
                 CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_108 + (local_318._0_8_ & 0xffffffff) * 0x18),
                  (value_type *)(local_318 + 8));
      if ((char *)local_318._8_8_ != local_308._M_local_buf + 8) {
        operator_delete((void *)local_318._8_8_,local_308._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_) !=
          &local_148.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_),
                        local_148.field_2._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(uStack_124,local_128) != local_118) {
        operator_delete((long *)CONCAT44(uStack_124,local_128),local_118[0] + 1);
      }
      if ((char *)local_348._8_8_ != pcVar28) {
        operator_delete((void *)local_348._8_8_,local_338[0]._8_8_ + 1);
      }
      if ((Context *)local_368._0_8_ != (Context *)(local_368 + 0x10)) {
        operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
      }
      if ((Context *)local_2e8._0_8_ != (Context *)(local_2e8 + 0x10)) {
        operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
      }
    }
    this_02 = (ShaderProgram *)operator_new(0xd0);
    glu::ShaderProgram::ShaderProgram
              (this_02,((this->super_TestCase).m_context)->m_renderCtx,(ProgramSources *)local_108);
    local_2c8 = (undefined1  [8])0x0;
    this_00 = &this->m_program;
    if ((this->m_program).
        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr !=
        this_02) {
      de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
                (&this_00->
                  super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
      (this_00->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).
      m_data.ptr = this_02;
    }
    de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
              ((UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)local_2c8)
    ;
    dVar14 = (**(code **)(local_2f0 + 0x800))();
    glu::checkError(dVar14,"build program",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0xeca);
    log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_2c8 = (undefined1  [8])local_2b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"ShaderProgram","");
    local_348._0_8_ = local_338;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"Shader program","");
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)local_318,log,(string *)local_2c8,(string *)local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._0_8_ != local_338) {
      operator_delete((void *)local_348._0_8_,local_338[0]._M_allocated_capacity + 1);
    }
    if (local_2c8 != (undefined1  [8])local_2b8) {
      operator_delete((void *)local_2c8,local_2b8[0]._M_allocated_capacity + 1);
    }
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                    (this->m_program).
                    super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
                    m_data.ptr);
    tcu::TestLog::endSection((TestLog *)local_318._0_8_);
    if ((((this_00->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).
          m_data.ptr)->m_program).m_info.linkOk != false) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_58);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_78);
      lVar25 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_108 + lVar25));
        lVar25 = lVar25 + -0x18;
      } while (lVar25 != -0x18);
      local_108._0_8_ = (pointer)0x0;
      local_108._8_8_ = (pointer)0x0;
      local_108._16_8_ = (pointer)0x0;
      local_348._0_8_ = (pointer)0x0;
      local_348._8_8_ = 0;
      local_318._0_8_ = &DAT_3f8000003f800000;
      local_318._8_8_ = &DAT_3f8000003f800000;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_2c8,
                 (long)(this->m_gridSize * this->m_gridSize),(allocator_type *)local_368);
      deRandom_init((deRandom *)local_368,0xab54321);
      uVar15 = (uint)((ulong)((long)_Stack_2c0._M_current - (long)local_2c8) >> 2);
      if (0 < (int)uVar15) {
        uVar20 = 0;
        do {
          *(int *)((long)local_2c8 + uVar20 * 4) = (int)uVar20;
          uVar20 = uVar20 + 1;
        } while ((uVar15 & 0x7fffffff) != uVar20);
      }
      de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((Random *)local_368,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_2c8,
                 _Stack_2c0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_108
                 ,(long)(this->m_gridSize * this->m_gridSize * 0xc));
      if (0 < (int)((ulong)((long)_Stack_2c0._M_current - (long)local_2c8) >> 2)) {
        iVar13 = 0;
        lVar25 = 0;
        do {
          iVar4 = this->m_gridSize;
          iVar7 = *(int *)((long)local_2c8 + lVar25 * 4) / iVar4;
          iVar8 = *(int *)((long)local_2c8 + lVar25 * 4) % iVar4;
          puVar21 = (undefined8 *)local_318;
          if ((iVar7 + iVar8 & 1U) == 0) {
            puVar21 = (undefined8 *)local_348;
          }
          fVar37 = (float)iVar8;
          fVar36 = fVar37 / (float)iVar4;
          fVar35 = (float)iVar7;
          fVar39 = fVar35 / (float)iVar4;
          iVar4 = (int)lVar25;
          lVar29 = (long)(iVar4 * 0xc) * 0x10;
          *(float *)(local_108._0_8_ + lVar29) = fVar36 + fVar36 + -1.0;
          *(float *)(local_108._0_8_ + lVar29 + 4) = fVar39 + fVar39 + -1.0;
          pcVar1 = (pointer)(local_108._0_8_ + lVar29 + 8);
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
          uVar9 = puVar21[1];
          fVar36 = (float)(iVar8 + 1);
          *(undefined8 *)(local_108._0_8_ + (long)(iVar4 * 0xc + 1) * 0x10) = *puVar21;
          *(undefined8 *)((pointer)(local_108._0_8_ + (long)(iVar4 * 0xc + 1) * 0x10) + 8) = uVar9;
          fVar41 = fVar36 / (float)this->m_gridSize;
          fVar39 = (float)(iVar7 + 1);
          fVar42 = fVar39 / (float)this->m_gridSize;
          lVar29 = (long)(iVar4 * 0xc + 2) * 0x10;
          *(float *)(local_108._0_8_ + lVar29) = fVar41 + fVar41 + -1.0;
          *(float *)(local_108._0_8_ + lVar29 + 4) = fVar42 + fVar42 + -1.0;
          pcVar1 = (pointer)(local_108._0_8_ + lVar29 + 8);
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
          uVar9 = puVar21[1];
          *(undefined8 *)(local_108._0_8_ + (long)(iVar4 * 0xc + 3) * 0x10) = *puVar21;
          *(undefined8 *)((pointer)(local_108._0_8_ + (long)(iVar4 * 0xc + 3) * 0x10) + 8) = uVar9;
          fVar41 = fVar37 / (float)this->m_gridSize;
          fVar42 = fVar39 / (float)this->m_gridSize;
          lVar29 = (long)(iVar4 * 0xc + 4) * 0x10;
          *(float *)(local_108._0_8_ + lVar29) = fVar41 + fVar41 + -1.0;
          *(float *)(local_108._0_8_ + lVar29 + 4) = fVar42 + fVar42 + -1.0;
          pcVar1 = (pointer)(local_108._0_8_ + lVar29 + 8);
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
          uVar9 = puVar21[1];
          *(undefined8 *)(local_108._0_8_ + (long)(iVar4 * 0xc + 5) * 0x10) = *puVar21;
          *(undefined8 *)((pointer)(local_108._0_8_ + (long)(iVar4 * 0xc + 5) * 0x10) + 8) = uVar9;
          fVar37 = fVar37 / (float)this->m_gridSize;
          fVar41 = fVar35 / (float)this->m_gridSize;
          lVar29 = (long)(iVar4 * 0xc + 6) * 0x10;
          *(float *)(local_108._0_8_ + lVar29) = fVar37 + fVar37 + -1.0;
          *(float *)(local_108._0_8_ + lVar29 + 4) = fVar41 + fVar41 + -1.0;
          pcVar1 = (pointer)(local_108._0_8_ + lVar29 + 8);
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
          uVar9 = puVar21[1];
          *(undefined8 *)(local_108._0_8_ + (long)(iVar4 * 0xc + 7) * 0x10) = *puVar21;
          *(undefined8 *)((pointer)(local_108._0_8_ + (long)(iVar4 * 0xc + 7) * 0x10) + 8) = uVar9;
          fVar37 = fVar36 / (float)this->m_gridSize;
          fVar35 = fVar35 / (float)this->m_gridSize;
          lVar29 = (long)(iVar4 * 0xc + 8) * 0x10;
          *(float *)(local_108._0_8_ + lVar29) = fVar37 + fVar37 + -1.0;
          *(float *)(local_108._0_8_ + lVar29 + 4) = fVar35 + fVar35 + -1.0;
          pcVar1 = (pointer)(local_108._0_8_ + lVar29 + 8);
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
          uVar9 = puVar21[1];
          *(undefined8 *)(local_108._0_8_ + (long)(iVar4 * 0xc + 9) * 0x10) = *puVar21;
          *(undefined8 *)((pointer)(local_108._0_8_ + (long)(iVar4 * 0xc + 9) * 0x10) + 8) = uVar9;
          fVar36 = fVar36 / (float)this->m_gridSize;
          fVar39 = fVar39 / (float)this->m_gridSize;
          lVar29 = (long)(iVar4 * 0xc + 10) * 0x10;
          *(float *)(local_108._0_8_ + lVar29) = fVar36 + fVar36 + -1.0;
          *(float *)(local_108._0_8_ + lVar29 + 4) = fVar39 + fVar39 + -1.0;
          pcVar1 = (pointer)(local_108._0_8_ + lVar29 + 8);
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
          uVar9 = puVar21[1];
          *(undefined8 *)(local_108._0_8_ + (long)(iVar4 * 0xc + 0xb) * 0x10) = *puVar21;
          *(undefined8 *)((pointer)(local_108._0_8_ + (long)(iVar4 * 0xc + 0xb) * 0x10) + 8) = uVar9
          ;
          lVar29 = 0;
          do {
            fVar35 = deRandom_getFloat((deRandom *)local_368);
            *(float *)(local_108._0_8_ + (long)((int)lVar29 + iVar13) * 0x10 + 8) = fVar35 + 0.0;
            lVar29 = lVar29 + 2;
          } while (lVar29 != 0xc);
          lVar29 = 0;
          do {
            fVar35 = deRandom_getFloat((deRandom *)local_368);
            *(float *)(local_108._0_8_ + (long)((int)lVar29 + iVar13) * 0x10 + 0xc) = fVar35 + 0.0;
            lVar29 = lVar29 + 2;
          } while (lVar29 != 0xc);
          lVar25 = lVar25 + 1;
          iVar13 = iVar13 + 0xc;
        } while (lVar25 < (int)((ulong)((long)_Stack_2c0._M_current - (long)local_2c8) >> 2));
      }
      if (local_2c8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_2c8,local_2b8[0]._M_allocated_capacity - (long)local_2c8);
      }
      this_03 = (ObjectWrapper *)operator_new(0x18);
      iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      traits = glu::objectTraits(OBJECTTYPE_BUFFER);
      glu::ObjectWrapper::ObjectWrapper
                (this_03,(Functions *)CONCAT44(extraout_var_00,iVar13),traits);
      local_2c8 = (undefined1  [8])0x0;
      this_01 = &this->m_vbo;
      if (&((this->m_vbo).
            super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
            .m_data.ptr)->super_ObjectWrapper != this_03) {
        de::details::
        UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
        ::reset(&this_01->
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
               );
        (this_01->
        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
        ).m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)1> *)this_03;
      }
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
      ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
               *)local_2c8);
      (**(code **)(local_2f0 + 0x40))
                (0x8892,(((this_01->
                          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                          ).m_data.ptr)->super_ObjectWrapper).m_object);
      (**(code **)(local_2f0 + 0x150))
                (0x8892,(long)(local_108._8_4_ - (int)local_108._0_8_) & 0xfffffffffffffff0,
                 local_108._0_8_,0x88e4);
      dVar14 = (**(code **)(local_2f0 + 0x800))();
      glu::checkError(dVar14,"buf upload",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                      ,0xedd);
      if ((pointer)local_108._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
      }
      deRandom_init((deRandom *)local_348,0x12345);
      uVar34 = (ulong)this->m_numLayers;
      pLVar17 = (this->m_layers).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pLVar32 = (this->m_layers).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar25 = (long)pLVar32 - (long)pLVar17 >> 3;
      uVar20 = lVar25 * -0x3333333333333333;
      uVar33 = uVar34 + lVar25 * 0x3333333333333333;
      if (uVar34 < uVar20 || uVar33 == 0) {
        if ((uVar34 < uVar20) && (pLVar17 = pLVar17 + uVar34, pLVar32 != pLVar17)) {
          (this->m_layers).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish = pLVar17;
        }
      }
      else if ((ulong)(((long)(this->m_layers).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pLVar32 >>
                       3) * -0x3333333333333333) < uVar33) {
        if (lVar25 * 0x3333333333333333 + 0x333333333333333U < uVar33) {
          std::__throw_length_error("vector::_M_default_append");
        }
        uVar22 = uVar33;
        if (uVar33 <= uVar20 && uVar20 - uVar33 != 0) {
          uVar22 = uVar20;
        }
        uVar31 = uVar22 + uVar20;
        if (0x333333333333332 < uVar31) {
          uVar31 = 0x333333333333333;
        }
        if (CARRY8(uVar22,uVar20)) {
          uVar31 = 0x333333333333333;
        }
        if (uVar31 == 0) {
          pLVar17 = (pointer)0x0;
        }
        else {
          pLVar17 = (pointer)operator_new(uVar31 * 0x28);
        }
        memset((pLVar17->color1).m_data + lVar25 * 2 + -2,0,uVar33 * 0x28);
        pLVar6 = (this->m_layers).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pLVar32 = (this->m_layers).
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pLVar23 = pLVar17;
        for (pLVar26 = pLVar32; pLVar26 != pLVar6; pLVar26 = pLVar26 + 1) {
          fVar35 = pLVar26->zScale;
          pLVar23->zOffset = pLVar26->zOffset;
          pLVar23->zScale = fVar35;
          lVar25 = 2;
          do {
            (pLVar23->color1).m_data[lVar25 + -2] = (pLVar26->color1).m_data[lVar25 + -2];
            lVar25 = lVar25 + 1;
          } while (lVar25 != 6);
          lVar25 = 6;
          do {
            (pLVar23->color1).m_data[lVar25 + -2] = (pLVar26->color1).m_data[lVar25 + -2];
            lVar25 = lVar25 + 1;
          } while (lVar25 != 10);
          pLVar23 = pLVar23 + 1;
        }
        if (pLVar32 != (pointer)0x0) {
          operator_delete(pLVar32,(long)(this->m_layers).
                                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pLVar32);
        }
        (this->m_layers).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = pLVar17;
        (this->m_layers).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = pLVar17 + uVar34;
        (this->m_layers).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pLVar17 + uVar31;
      }
      else {
        memset(pLVar32,0,uVar33 * 0x28);
        (this->m_layers).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = pLVar32 + uVar33;
      }
      uVar20 = (ulong)(uint)this->m_numLayers;
      if (0 < this->m_numLayers) {
        lVar25 = 0;
        lVar29 = 0;
        do {
          fVar35 = (float)(int)lVar29 / (float)(int)uVar20;
          pLVar17 = (this->m_layers).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(float *)((long)(pLVar17->color1).m_data + lVar25 + -8) = fVar35 + fVar35 + -1.0;
          *(float *)((long)(pLVar17->color1).m_data + lVar25 + -4) = 2.0 / (float)(int)uVar20;
          uVar38 = 0;
          if (lVar25 == 0) {
            uVar40 = 0;
            uVar38 = 0x3f800000;
          }
          else {
            uVar40 = 0x3f800000;
          }
          *(undefined4 *)((long)(pLVar17->color1).m_data + lVar25) = 0;
          *(undefined4 *)((long)(pLVar17->color1).m_data + lVar25 + 4) = uVar38;
          *(undefined4 *)((long)(pLVar17->color1).m_data + lVar25 + 8) = uVar40;
          *(undefined4 *)((long)(pLVar17->color1).m_data + lVar25 + 0xc) = 0x3f800000;
          pLVar17 = (this->m_layers).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(undefined4 *)((long)(pLVar17->color2).m_data + lVar25) = 0x3f800000;
          *(undefined4 *)((long)(pLVar17->color2).m_data + lVar25 + 4) = uVar38;
          *(undefined4 *)((long)(pLVar17->color2).m_data + lVar25 + 8) = uVar40;
          *(undefined4 *)((long)(pLVar17->color2).m_data + lVar25 + 0xc) = 0x3f800000;
          lVar29 = lVar29 + 1;
          uVar20 = (ulong)this->m_numLayers;
          lVar25 = lVar25 + 0x28;
        } while (lVar29 < (long)uVar20);
      }
      pLVar17 = (this->m_layers).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar15 = (int)((ulong)((long)(this->m_layers).
                                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar17) >> 3)
               * -0x33333333 - 1;
      if (0 < (int)uVar15) {
        uVar20 = (ulong)uVar15 + 1;
        pLVar32 = pLVar17 + uVar15;
        do {
          dVar14 = deRandom_getUint32((deRandom *)local_348);
          iVar13 = (int)((ulong)dVar14 % (uVar20 & 0xffffffff));
          uVar15 = iVar13 * 5;
          fVar39 = pLVar32->zOffset;
          fVar37 = pLVar32->zScale;
          local_2c8 = *(undefined1 (*) [8])(pLVar32->color1).m_data;
          _Stack_2c0._M_current = *(int **)((pLVar32->color1).m_data + 2);
          local_108._0_8_ = *(undefined8 *)(pLVar32->color2).m_data;
          local_108._8_8_ = *(undefined8 *)((pLVar32->color2).m_data + 2);
          *(undefined8 *)((pLVar32->color2).m_data + 2) =
               *(undefined8 *)(pLVar17[iVar13].color2.m_data + 2);
          pLVar6 = pLVar17 + iVar13;
          fVar35 = pLVar6->zOffset;
          fVar36 = pLVar6->zScale;
          uVar9 = *(undefined8 *)(pLVar6->color1).m_data;
          pfVar2 = pLVar17[iVar13].color1.m_data + 2;
          uVar10 = *(undefined8 *)(pfVar2 + 2);
          *(undefined8 *)((pLVar32->color1).m_data + 2) = *(undefined8 *)pfVar2;
          *(undefined8 *)(pLVar32->color2).m_data = uVar10;
          pLVar32->zOffset = fVar35;
          pLVar32->zScale = fVar36;
          *(undefined8 *)(pLVar32->color1).m_data = uVar9;
          pLVar17[iVar13].zOffset = fVar39;
          pLVar17[iVar13].zScale = fVar37;
          *(undefined1 (*) [8])pLVar17[iVar13].color1.m_data = local_2c8;
          *(int **)(pLVar17[iVar13].color1.m_data + 2) = _Stack_2c0._M_current;
          *(undefined8 *)pLVar17[iVar13].color2.m_data = local_108._0_8_;
          *(undefined8 *)(pLVar17[iVar13].color2.m_data + 2) = local_108._8_8_;
          uVar20 = uVar20 - 1;
          pLVar32 = pLVar32 + -1;
        } while (1 < (long)uVar20);
      }
      return uVar15;
    }
    this_04 = (TestError *)__cxa_allocate_exception(0x38);
    local_2c8 = (undefined1  [8])local_2b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2c8,"failed to build program","");
    tcu::TestError::TestError(this_04,(string *)local_2c8);
    __cxa_throw(this_04,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_148._M_dataplus._M_p._0_4_ = 0x100;
  de::toString<int>((string *)local_368,(int *)&local_148);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318,
                 "Test requires ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368);
  plVar19 = (long *)std::__cxx11::string::append(local_318);
  local_348._0_8_ = *plVar19;
  paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar19 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._0_8_ == paVar24) {
    local_338[0]._0_8_ = paVar24->_M_allocated_capacity;
    local_338[0]._8_8_ = plVar19[3];
    local_348._0_8_ = local_338;
  }
  else {
    local_338[0]._0_8_ = paVar24->_M_allocated_capacity;
  }
  local_348._8_8_ = plVar19[1];
  *plVar19 = (long)paVar24;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  local_128 = 0x100;
  de::toString<int>((string *)local_2e8,&local_128);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
  plVar19 = (long *)std::__cxx11::string::append(local_108);
  local_2c8 = (undefined1  [8])*plVar19;
  paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar19 + 2);
  if (local_2c8 == (undefined1  [8])paVar24) {
    local_2b8[0]._0_8_ = paVar24->_M_allocated_capacity;
    local_2b8[0]._8_8_ = plVar19[3];
    local_2c8 = (undefined1  [8])local_2b8;
  }
  else {
    local_2b8[0]._0_8_ = paVar24->_M_allocated_capacity;
  }
  _Stack_2c0._M_current = (int *)plVar19[1];
  *plVar19 = (long)paVar24;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  tcu::NotSupportedError::NotSupportedError(pNVar18,(string *)local_2c8);
  __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void DepthDrawCase::init (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const bool				supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	// requirements

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_primitive_bounding_box"))
		throw tcu::NotSupportedError("Test requires GL_EXT_primitive_bounding_box extension");
	if (m_state == STATE_PER_PRIMITIVE && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");
	if (m_context.getRenderTarget().getDepthBits() == 0)
		throw tcu::NotSupportedError("Test requires depth buffer");
	if (m_context.getRenderTarget().getWidth() < RENDER_AREA_SIZE || m_context.getRenderTarget().getHeight() < RENDER_AREA_SIZE)
		throw tcu::NotSupportedError("Test requires " + de::toString<int>(RENDER_AREA_SIZE) + "x" + de::toString<int>(RENDER_AREA_SIZE) + " viewport");

	// log
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Rendering multiple triangle grids with with different z coordinates.\n"
		<< "Topmost grid is green-yellow, other grids are blue-red.\n"
		<< "Expecting only the green-yellow grid to be visible.\n"
		<< "Setting primitive bounding box "
			<< ((m_bboxSize == BBOX_EQUAL) ? ("to exactly cover") : ("to cover"))
			<< ((m_state == STATE_GLOBAL) ? (" each grid") : (" each triangle"))
			<< ((m_bboxSize == BBOX_EQUAL) ? (".") : (" and include some padding."))
			<< "\n"
		<< "Set bounding box using "
			<< ((m_state == STATE_GLOBAL) ? ("PRIMITIVE_BOUNDING_BOX_EXT state") : ("gl_BoundingBoxEXT output"))
			<< "\n"
		<< ((m_depthType == DEPTH_USER_DEFINED) ? ("Fragment depth is set in the fragment shader") : (""))
		<< tcu::TestLog::EndMessage;

	// resources

	{
		glu::ProgramSources sources;
		sources << glu::VertexSource(specializeShader(m_context, genVertexSource().c_str()));
		sources << glu::FragmentSource(specializeShader(m_context, genFragmentSource().c_str()));

		if (m_state == STATE_PER_PRIMITIVE)
			sources << glu::TessellationControlSource(specializeShader(m_context, genTessellationControlSource().c_str()))
					<< glu::TessellationEvaluationSource(specializeShader(m_context, genTessellationEvaluationSource().c_str()));

		m_program = de::MovePtr<glu::ShaderProgram>(new glu::ShaderProgram(m_context.getRenderContext(), sources));
		GLU_EXPECT_NO_ERROR(gl.getError(), "build program");

		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "ShaderProgram", "Shader program");
			m_testCtx.getLog() << *m_program;
		}

		if (!m_program->isOk())
			throw tcu::TestError("failed to build program");
	}

	{
		std::vector<tcu::Vec4> data;

		generateAttributeData(data);

		m_vbo = de::MovePtr<glu::Buffer>(new glu::Buffer(m_context.getRenderContext()));
		gl.bindBuffer(GL_ARRAY_BUFFER, **m_vbo);
		gl.bufferData(GL_ARRAY_BUFFER, (int)(sizeof(tcu::Vec4) * data.size()), &data[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "buf upload");
	}

	// gen layers
	{
		de::Random rnd(0x12345);

		m_layers.resize(m_numLayers);
		for (int layerNdx = 0; layerNdx < m_numLayers; ++layerNdx)
		{
			m_layers[layerNdx].zOffset	= ((float)layerNdx / (float)m_numLayers) * 2.0f - 1.0f;
			m_layers[layerNdx].zScale	= (2.0f / (float)m_numLayers);
			m_layers[layerNdx].color1	= (layerNdx == 0) ? (tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f)) : (tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));
			m_layers[layerNdx].color2	= (layerNdx == 0) ? (tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f)) : (tcu::Vec4(1.0f, 0.0f, 1.0f, 1.0f));
		}
		rnd.shuffle(m_layers.begin(), m_layers.end());
	}
}